

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

int __thiscall CTcSymFuncBase::write_to_sym_file(CTcSymFuncBase *this,CVmFile *fp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  CTcSymFunc *pCVar4;
  byte bVar5;
  uint16_t tmp;
  CTcSymFunc *pCVar6;
  undefined1 auVar7 [16];
  char b [2];
  undefined2 local_1a;
  undefined4 local_18;
  byte local_14;
  byte local_13;
  byte local_12;
  
  pCVar4 = this->mod_base_;
  do {
    pCVar6 = pCVar4;
    if (pCVar6 == (CTcSymFunc *)0x0) {
      bVar5 = 0;
      goto LAB_001d9023;
    }
    pCVar4 = (pCVar6->super_CTcSymFuncBase).mod_base_;
  } while (pCVar4 != (CTcSymFunc *)0x0);
  bVar5 = ((pCVar6->super_CTcSymFuncBase).field_0x80 & 4) >> 2;
LAB_001d9023:
  bVar3 = this->field_0x80;
  if ((bVar3 & 4) == 0) {
    if (((bVar3 & 0x40) != 0) || (bVar5 == 0 && (bVar3 & 8) == 0)) {
LAB_001d9047:
      local_1a = *(undefined2 *)
                  &(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                   super_CVmHashEntry.field_0x24;
      CVmFile::write_bytes(fp,(char *)&local_1a,2);
      CTcSymbolBase::write_name_to_file((CTcSymbolBase *)this,fp);
      uVar1 = this->argc_;
      uVar2 = this->opt_argc_;
      auVar7._4_4_ = uVar2;
      auVar7._0_4_ = uVar1;
      auVar7._8_8_ = 0;
      auVar7 = pshuflw(auVar7,auVar7,0xe8);
      local_18 = auVar7._0_4_;
      bVar5 = this->field_0x80;
      local_14 = bVar5 & 1;
      local_13 = bVar5 >> 1 & 1;
      local_12 = bVar5 >> 4 & 3;
      CVmFile::write_bytes(fp,(char *)&local_18,7);
      return 1;
    }
  }
  else if ((bVar3 & 0x40) != 0) goto LAB_001d9047;
  return 0;
}

Assistant:

int CTcSymFuncBase::write_to_sym_file(CVmFile *fp)
{
    char buf[7];
    CTcSymFunc *cur;
    int ext_modify;

    /* scan for the bottom of our modify stack */
    for (cur = get_mod_base() ; cur != 0 && cur->get_mod_base() != 0 ;
         cur = cur->get_mod_base()) ;

    /* we modify an external if the bottom of our modify stack is external */
    ext_modify = (cur != 0 && cur->is_extern());

    /* 
     *   If we're external, don't bother writing to the file - if we're
     *   importing a function, we don't want to export it as well.  Note that
     *   a function that is replacing or modifying an external function is
     *   fundamentally external itself, because the function must be defined
     *   in another file to be replaceable/modifiable.
     *   
     *   As an exception, if this is a multi-method base symbol, and a
     *   multi-method with this name is defined in this file, export it even
     *   though it's technically an extern symbol.  We don't export most
     *   extern symbols because we count on the definer to export them, but
     *   in the case of multi-method base symbols, there is no definer - the
     *   base symbol is basically a placeholder to be filled in by the
     *   linker.  So *someone* has to export these.  The logical place to
     *   export them is from any file that defines a multi-method based on
     *   the base symbol.  
     */
    if ((is_extern_ || ext_replace_ || ext_modify) && !mm_def_)
        return FALSE;

    /* inherit default */
    CTcSymbol::write_to_sym_file(fp);

    /* write our argument count, varargs flag, and return value flag */
    oswp2(buf, argc_);
    oswp2(buf + 2, opt_argc_);
    buf[4] = (varargs_ != 0);
    buf[5] = (has_retval_ != 0);
    buf[6] = (is_multimethod_ ? 1 : 0)
             | (is_multimethod_base_ ? 2 : 0);
    fp->write_bytes(buf, 7);

    /* we wrote the symbol */
    return TRUE;
}